

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.cpp
# Opt level: O2

TypeInfos * anon_unknown.dwarf_210771d::TypeInfos::get(void)

{
  undefined8 in_RAX;
  TypeInfos *pTVar1;
  allocator<char> local_29;
  string local_28;
  
  pTVar1 = (TypeInfos *)
           CONCAT71((int7)((ulong)in_RAX >> 8),(anonymous_namespace)::TypeInfos::get()::instance);
  if ((anonymous_namespace)::TypeInfos::get()::instance == '\0') {
    pTVar1 = (TypeInfos *)__cxa_guard_acquire(&(anonymous_namespace)::TypeInfos::get()::instance);
    if ((int)pTVar1 != 0) {
      memset(&get::memory,0,0x118);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"boolean",&local_29);
      dap::BasicTypeInfo<dap::boolean>::BasicTypeInfo
                ((BasicTypeInfo<dap::boolean> *)&get::memory,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"string",&local_29);
      dap::
      BasicTypeInfo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::BasicTypeInfo((BasicTypeInfo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(get::memory.data + 0x28),&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"integer",&local_29);
      dap::BasicTypeInfo<dap::integer>::BasicTypeInfo
                ((BasicTypeInfo<dap::integer> *)(get::memory.data + 0x50),&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"number",&local_29);
      dap::BasicTypeInfo<dap::number>::BasicTypeInfo
                ((BasicTypeInfo<dap::number> *)(get::memory.data + 0x78),&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"object",&local_29);
      dap::
      BasicTypeInfo<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>_>
      ::BasicTypeInfo((BasicTypeInfo<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>_>
                       *)(get::memory.data + 0xa0),&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"any",&local_29);
      dap::BasicTypeInfo<dap::any>::BasicTypeInfo
                ((BasicTypeInfo<dap::any> *)(get::memory.data + 200),&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      get::memory.data._240_8_ = &PTR__TypeInfo_00947638;
      get::memory.data[0xf8] = '\0';
      get::memory.data[0xf9] = '\0';
      get::memory.data[0xfa] = '\0';
      get::memory.data[0xfb] = '\0';
      get::memory.data[0xfc] = '\0';
      get::memory.data[0xfd] = '\0';
      get::memory.data[0xfe] = '\0';
      get::memory.data[0xff] = '\0';
      get::memory.data[0x100] = '\0';
      get::memory.data[0x101] = '\0';
      get::memory.data[0x102] = '\0';
      get::memory.data[0x103] = '\0';
      get::memory.data[0x104] = '\0';
      get::memory.data[0x105] = '\0';
      get::memory.data[0x106] = '\0';
      get::memory.data[0x107] = '\0';
      get::memory.data[0x108] = '\0';
      get::memory.data[0x109] = '\0';
      get::memory.data[0x10a] = '\0';
      get::memory.data[0x10b] = '\0';
      get::memory.data[0x10c] = '\0';
      get::memory.data[0x10d] = '\0';
      get::memory.data[0x10e] = '\0';
      get::memory.data[0x10f] = '\0';
      get::memory.data[0x110] = '\x01';
      get::memory.data[0x111] = '\0';
      get::memory.data[0x112] = '\0';
      get::memory.data[0x113] = '\0';
      get::memory.data[0x114] = '\0';
      get::memory.data[0x115] = '\0';
      get::memory.data[0x116] = '\0';
      get::memory.data[0x117] = '\0';
      __cxa_atexit(get::Instance::~Instance,&(anonymous_namespace)::TypeInfos::get()::instance,
                   &__dso_handle);
      pTVar1 = (TypeInfos *)__cxa_guard_release(&(anonymous_namespace)::TypeInfos::get()::instance);
    }
  }
  return pTVar1;
}

Assistant:

TypeInfos* TypeInfos::get() {
  static aligned_storage<sizeof(TypeInfos), alignof(TypeInfos)>::type memory;

  struct Instance {
    TypeInfos* ptr() { return reinterpret_cast<TypeInfos*>(memory.data); }
    Instance() { new (ptr()) TypeInfos(); }
    ~Instance() { ptr()->release(); }
  };

  static Instance instance;
  return instance.ptr();
}